

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

void __thiscall
icu_63::MessagePatternList<icu_63::MessagePattern::Part,_32>::copyFrom
          (MessagePatternList<icu_63::MessagePattern::Part,_32> *this,
          MessagePatternList<icu_63::MessagePattern::Part,_32> *other,int32_t length,
          UErrorCode *errorCode)

{
  Part *pPVar1;
  
  if ((length < 1) || (U_ZERO_ERROR < *errorCode)) {
    return;
  }
  if (((this->a).capacity < length) &&
     (pPVar1 = MaybeStackArray<icu_63::MessagePattern::Part,_32>::resize(&this->a,length,0),
     pPVar1 == (Part *)0x0)) {
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
    return;
  }
  memcpy((this->a).ptr,(other->a).ptr,(ulong)(uint)length << 4);
  return;
}

Assistant:

void
MessagePatternList<T, stackCapacity>::copyFrom(
        const MessagePatternList<T, stackCapacity> &other,
        int32_t length,
        UErrorCode &errorCode) {
    if(U_SUCCESS(errorCode) && length>0) {
        if(length>a.getCapacity() && NULL==a.resize(length)) {
            errorCode=U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        uprv_memcpy(a.getAlias(), other.a.getAlias(), (size_t)length*sizeof(T));
    }
}